

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_Deserialize(ktxHashList *pHead,uint kvdLen,void *pKvd)

{
  uint uVar1;
  uint *puVar2;
  uint *in_RDX;
  uint in_ESI;
  long *in_RDI;
  bool bVar3;
  undefined1 extraout_var [12];
  undefined1 auVar4 [16];
  ktx_uint32_t keyAndValueByteSize;
  void *value;
  uint valueLen;
  uint keyLen;
  char *key;
  ktx_error_code_e result;
  char *src;
  uint local_3c;
  ktx_error_code_e local_2c;
  uint *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_ESI == 0) || (in_RDX == (uint *)0x0)) || (in_RDI == (long *)0x0)) {
    local_2c = KTX_INVALID_VALUE;
  }
  else if (*in_RDI == 0) {
    local_2c = KTX_SUCCESS;
    local_28 = in_RDX;
    while (local_2c == KTX_SUCCESS && local_28 < (uint *)((long)in_RDX + (ulong)in_ESI)) {
      if ((char *)((long)in_RDX + (ulong)in_ESI) < (char *)((long)local_28 + 6)) {
        return KTX_FILE_DATA_ERROR;
      }
      uVar1 = *local_28;
      if ((char *)((long)in_RDX + (ulong)in_ESI) < (char *)((long)local_28 + (ulong)uVar1 + 4)) {
        return KTX_FILE_DATA_ERROR;
      }
      puVar2 = local_28 + 1;
      local_3c = 0;
      while( true ) {
        bVar3 = false;
        if (local_3c < uVar1) {
          bVar3 = *(char *)((long)puVar2 + (ulong)local_3c) != '\0';
        }
        if (!bVar3) break;
        local_3c = local_3c + 1;
      }
      if ((local_3c == uVar1) || (*(char *)((long)puVar2 + (ulong)local_3c) != '\0')) {
        return KTX_FILE_DATA_ERROR;
      }
      if (((2 < local_3c) && ((char)*puVar2 == -0x11)) &&
         ((*(char *)((long)local_28 + 5) == -0x45 && (*(char *)((long)local_28 + 6) == -0x41)))) {
        return KTX_FILE_DATA_ERROR;
      }
      local_2c = ktxHashList_AddKVPair
                           ((ktxHashList *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (char *)in_RDI,in_ESI,in_RDX);
      local_28 = puVar2;
      if (local_2c == KTX_SUCCESS) {
        auVar4._0_4_ = (float)uVar1 * 0.25;
        auVar4._4_12_ = extraout_var;
        auVar4 = roundss(auVar4,auVar4,10);
        local_28 = (uint *)((long)puVar2 + ((long)(auVar4._0_4_ * 4.0) & 0xffffffffU));
      }
    }
  }
  else {
    local_2c = KTX_INVALID_OPERATION;
  }
  return local_2c;
}

Assistant:

KTX_error_code
ktxHashList_Deserialize(ktxHashList* pHead, unsigned int kvdLen, void* pKvd)
{
    char* src = pKvd;
    KTX_error_code result;

    if (kvdLen == 0 || pKvd == NULL || pHead == NULL)
        return KTX_INVALID_VALUE;

    if (*pHead != NULL)
        return KTX_INVALID_OPERATION;

    result = KTX_SUCCESS;
    while (result == KTX_SUCCESS && src < (char *)pKvd + kvdLen) {
        if (src + 6 > (char *)pKvd + kvdLen) {
            // Not enough space for another entry
            return KTX_FILE_DATA_ERROR;
        }

        char* key;
        unsigned int keyLen, valueLen;
        void* value;
        ktx_uint32_t keyAndValueByteSize = *((ktx_uint32_t*)src);

        if (src + 4 + keyAndValueByteSize > (char *)pKvd + kvdLen) {
            // Not enough space for this entry
            return KTX_FILE_DATA_ERROR;
        }

        src += sizeof(keyAndValueByteSize);
        key = src;
        keyLen = 0;

        while (keyLen < keyAndValueByteSize && key[keyLen] != '\0') keyLen++;

        if (keyLen == keyAndValueByteSize || key[keyLen] != '\0') {
            // Missing NULL terminator or no value
            return KTX_FILE_DATA_ERROR;
        }

        if (keyLen >= 3 && key[0] == '\xEF' && key[1] == '\xBB' && key[2] == '\xBF') {
            // Forbidden BOM
            return KTX_FILE_DATA_ERROR;
        }

        keyLen += 1;
        value = key + keyLen;

        valueLen = keyAndValueByteSize - keyLen;
        result = ktxHashList_AddKVPair(pHead, key, valueLen,
                                       valueLen > 0 ? value : NULL);
        if (result == KTX_SUCCESS) {
            src += _KTX_PAD4(keyAndValueByteSize);
        }
    }
    return result;
}